

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O3

RK_S32 mpi_enc_width_default_stride(RK_S32 width,MppFrameFormat fmt)

{
  uint uVar1;
  
  uVar1 = (fmt & 0xfffff) - MPP_FMT_RGB565;
  if (uVar1 < 0xe) {
    if ((0x3fU >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x3f00U >> (uVar1 & 0x1f) & 1) != 0) {
        return width * 4 + 0x1cU & 0xffffffe0;
      }
      return (width + 7U & 0xfffffff8) * 3;
    }
switchD_0010b16d_caseD_8:
    uVar1 = width * 2 + 0xe;
LAB_0010b17e:
    uVar1 = uVar1 & 0xfffffff0;
  }
  else {
    switch(fmt & 0xfffff) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV422SP:
    case MPP_FMT_YUV420SP_VU:
    case MPP_FMT_YUV422P:
    case MPP_FMT_YUV422SP_VU:
    case MPP_FMT_YUV400:
    case MPP_FMT_YUV444SP:
    case MPP_FMT_YUV444P:
      uVar1 = width + 7U & 0xfffffff8;
      break;
    default:
      uVar1 = 0;
      _mpp_log_l(2,"mpi_enc_utils","do not support type %d\n","mpi_enc_width_default_stride",fmt);
      break;
    case MPP_FMT_YUV420P:
      uVar1 = width + 0xf;
      goto LAB_0010b17e;
    case MPP_FMT_YUV422_YUYV:
    case MPP_FMT_YUV422_YVYU:
    case MPP_FMT_YUV422_UYVY:
    case MPP_FMT_YUV422_VYUY:
      goto switchD_0010b16d_caseD_8;
    }
  }
  return uVar1;
}

Assistant:

RK_S32 mpi_enc_width_default_stride(RK_S32 width, MppFrameFormat fmt)
{
    RK_S32 stride = 0;

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV400 :
    case MPP_FMT_YUV420SP :
    case MPP_FMT_YUV420SP_VU : {
        stride = MPP_ALIGN(width, 8);
    } break;
    case MPP_FMT_YUV420P : {
        /* NOTE: 420P need to align to 16 so chroma can align to 8 */
        stride = MPP_ALIGN(width, 16);
    } break;
    case MPP_FMT_YUV422P:
    case MPP_FMT_YUV422SP:
    case MPP_FMT_YUV422SP_VU: {
        /* NOTE: 422 need to align to 8 so chroma can align to 16 */
        stride = MPP_ALIGN(width, 8);
    } break;
    case MPP_FMT_YUV444SP :
    case MPP_FMT_YUV444P : {
        stride = MPP_ALIGN(width, 8);
    } break;
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555:
    case MPP_FMT_RGB444:
    case MPP_FMT_BGR444:
    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY : {
        /* NOTE: for vepu limitation */
        stride = MPP_ALIGN(width, 8) * 2;
    } break;
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        /* NOTE: for vepu limitation */
        stride = MPP_ALIGN(width, 8) * 3;
    } break;
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        /* NOTE: for vepu limitation */
        stride = MPP_ALIGN(width, 8) * 4;
    } break;
    default : {
        mpp_err_f("do not support type %d\n", fmt);
    } break;
    }

    return stride;
}